

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void openjtalk_pause(OpenJTalk *oj)

{
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if (g_psd->stop == false) {
    if (g_verbose) {
      openjtalk_pause_cold_1();
    }
    g_psd->pause = true;
    do {
      sleep_internal(100);
    } while (g_psd->speaking != false);
    g_psd->pause = false;
    if (g_verbose == true) {
      openjtalk_pause_cold_2();
    }
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_pause(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	if (g_psd->stop)
	{
		return;
	}

	if (g_verbose)
	{
		console_message(u8"[PAUSE処理開始]\n");
	}
	g_psd->pause = true;
	do
	{
		sleep_internal(100);
	} while (g_psd->speaking);
	g_psd->pause = false;
	if (g_verbose)
	{
		console_message(u8"[PAUSE処理終了]\n");
	}
}